

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::GetVariableLocation
          (InterfaceVariableScalarReplacement *this,Instruction *var,uint32_t *location)

{
  bool bVar1;
  uint32_t id;
  DecorationManager *this_00;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this_00 = IRContext::get_decoration_mgr((this->super_Pass).context_);
  id = Instruction::result_id(var);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:167:7)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:167:7)>
             ::_M_manager;
  local_38._M_unused._M_object = location;
  bVar1 = analysis::DecorationManager::WhileEachDecoration
                    (this_00,id,0x1e,
                     (function<bool_(const_spvtools::opt::Instruction_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return !bVar1;
}

Assistant:

bool InterfaceVariableScalarReplacement::GetVariableLocation(
    Instruction* var, uint32_t* location) {
  return !context()->get_decoration_mgr()->WhileEachDecoration(
      var->result_id(), uint32_t(spv::Decoration::Location),
      [location](const Instruction& inst) {
        *location =
            inst.GetSingleWordInOperand(kOpDecorateLiteralInOperandIndex);
        return false;
      });
}